

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

void __thiscall
duckdb::BlockIndexManager::SetMaxIndex
          (BlockIndexManager *this,idx_t new_index,TemporaryBufferSize size)

{
  ulong uVar1;
  atomic<unsigned_long> *paVar2;
  
  if ((this->manager).ptr != (TemporaryFileManager *)0x0) {
    uVar1 = this->max_index;
    if (new_index <= uVar1 && uVar1 - new_index != 0) {
      this->max_index = new_index;
      optional_ptr<duckdb::TemporaryFileManager,_true>::CheckValid(&this->manager);
      paVar2 = ((this->manager).ptr)->size_on_disk;
      LOCK();
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i - (uVar1 - new_index) * size;
      UNLOCK();
      return;
    }
    if (new_index <= uVar1) {
      return;
    }
    optional_ptr<duckdb::TemporaryFileManager,_true>::CheckValid(&this->manager);
    TemporaryFileManager::IncreaseSizeOnDisk((this->manager).ptr,(new_index - uVar1) * size);
  }
  this->max_index = new_index;
  return;
}

Assistant:

void BlockIndexManager::SetMaxIndex(const idx_t new_index, const TemporaryBufferSize size) {
	const auto temp_file_block_size =
	    size == TemporaryBufferSize::DEFAULT ? DEFAULT_BLOCK_ALLOC_SIZE : TemporaryBufferSizeToSize(size);
	if (!manager) {
		max_index = new_index;
	} else {
		auto old = max_index;
		if (new_index < old) {
			max_index = new_index;
			const auto difference = old - new_index;
			const auto size_on_disk = difference * temp_file_block_size;
			manager->DecreaseSizeOnDisk(size_on_disk);
		} else if (new_index > old) {
			const auto difference = new_index - old;
			const auto size_on_disk = difference * temp_file_block_size;
			manager->IncreaseSizeOnDisk(size_on_disk);
			// Increase can throw, so this is only updated after it was successfully updated
			max_index = new_index;
		}
	}
}